

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 MemBackendRelease(SyMemBackend *pBackend)

{
  SyMemBlock *pSVar1;
  SyMemBlock *pSVar2;
  SyMemBlock *pNext;
  SyMemBlock *pBlock;
  SyMemBackend *pBackend_local;
  
  pNext = pBackend->pBlocks;
  while (pBackend->nBlock != 0) {
    pSVar1 = pNext->pNext;
    (*pBackend->pMethods->xFree)(pNext);
    pBackend->nBlock = pBackend->nBlock - 1;
    if (pBackend->nBlock == 0) break;
    pSVar2 = pSVar1->pNext;
    (*pBackend->pMethods->xFree)(pSVar1);
    pBackend->nBlock = pBackend->nBlock - 1;
    if (pBackend->nBlock == 0) break;
    pSVar1 = pSVar2->pNext;
    (*pBackend->pMethods->xFree)(pSVar2);
    pBackend->nBlock = pBackend->nBlock - 1;
    if (pBackend->nBlock == 0) break;
    pNext = pSVar1->pNext;
    (*pBackend->pMethods->xFree)(pSVar1);
    pBackend->nBlock = pBackend->nBlock - 1;
  }
  if (pBackend->pMethods->xRelease != (_func_void_void_ptr *)0x0) {
    (*pBackend->pMethods->xRelease)(pBackend->pMethods->pUserData);
  }
  pBackend->pMethods = (SyMemMethods *)0x0;
  pBackend->pBlocks = (SyMemBlock *)0x0;
  return 0;
}

Assistant:

static sxi32 MemBackendRelease(SyMemBackend *pBackend)
{
	SyMemBlock *pBlock, *pNext;

	pBlock = pBackend->pBlocks;
	for(;;){
		if( pBackend->nBlock == 0 ){
			break;
		}
		pNext  = pBlock->pNext;
		pBackend->pMethods->xFree(pBlock);
		pBlock = pNext;
		pBackend->nBlock--;
		/* LOOP ONE */
		if( pBackend->nBlock == 0 ){
			break;
		}
		pNext  = pBlock->pNext;
		pBackend->pMethods->xFree(pBlock);
		pBlock = pNext;
		pBackend->nBlock--;
		/* LOOP TWO */
		if( pBackend->nBlock == 0 ){
			break;
		}
		pNext  = pBlock->pNext;
		pBackend->pMethods->xFree(pBlock);
		pBlock = pNext;
		pBackend->nBlock--;
		/* LOOP THREE */
		if( pBackend->nBlock == 0 ){
			break;
		}
		pNext  = pBlock->pNext;
		pBackend->pMethods->xFree(pBlock);
		pBlock = pNext;
		pBackend->nBlock--;
		/* LOOP FOUR */
	}
	if( pBackend->pMethods->xRelease ){
		pBackend->pMethods->xRelease(pBackend->pMethods->pUserData);
	}
	pBackend->pMethods = 0;
	pBackend->pBlocks  = 0;
#if defined(UNTRUST)
	pBackend->nMagic = 0x2626;
#endif
	return SXRET_OK;
}